

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shknam.c
# Opt level: O3

boolean saleable(monst *shkp,obj *obj)

{
  int iVar1;
  boolean bVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (long)(short)shkp[0x1b].misc_worn_check;
  bVar2 = '\x01';
  lVar4 = lVar3 * 0xc0;
  if (*(char *)(&PTR_false_rumor_start_00312468 + lVar3 * 0x18) != '\0') {
    lVar3 = 0;
    do {
      if (*(int *)(&DAT_00312474 + lVar3 * 8 + lVar4) == 0) break;
      iVar1 = *(int *)(&DAT_00312478 + lVar3 * 8 + lVar4);
      if (iVar1 < 0) {
        if (iVar1 + obj->otyp == 0) {
          return '\x01';
        }
      }
      else if (iVar1 == obj->oclass) {
        return '\x01';
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x14);
    bVar2 = '\0';
  }
  return bVar2;
}

Assistant:

boolean saleable(struct monst *shkp, struct obj *obj)
{
    int i, shp_indx = ESHK(shkp)->shoptype - SHOPBASE;
    const struct shclass *shp = &shtypes[shp_indx];

    if (shp->symb == RANDOM_CLASS) return TRUE;
    else for (i = 0; i < SIZE(shtypes[0].iprobs) && shp->iprobs[i].iprob; i++)
		if (shp->iprobs[i].itype < 0 ?
			shp->iprobs[i].itype == - obj->otyp :
			shp->iprobs[i].itype == obj->oclass) return TRUE;
    /* not found */
    return FALSE;
}